

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

void __thiscall
phyr::SurfaceInteraction::setShadingGeomerty
          (SurfaceInteraction *this,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,Normal3f *dndvs,
          bool overridesOrientation)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  byte in_R9B;
  Normal3<double> *in_stack_ffffffffffffff40;
  Normal3<double> *in_stack_ffffffffffffff48;
  Normal3<double> *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  undefined8 local_a0;
  Vector3<double> *in_stack_ffffffffffffff68;
  Vector3<double> *in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 local_80;
  Vector3<double> local_78;
  Normal3<double> local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  byte local_29;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  cross<double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Normal3<double>::Normal3(&local_60,&local_78);
  normalize<double>(in_stack_ffffffffffffff50);
  *(undefined8 *)(in_RDI + 0x138) = local_48;
  *(undefined8 *)(in_RDI + 0x140) = local_40;
  *(undefined8 *)(in_RDI + 0x148) = local_38;
  if ((*(long *)(in_RDI + 0xd8) != 0) &&
     ((*(byte *)(*(long *)(in_RDI + 0xd8) + 0x18) & 1) !=
      (*(byte *)(*(long *)(in_RDI + 0xd8) + 0x19) & 1))) {
    Normal3<double>::operator-(in_stack_ffffffffffffff40);
    *(Vector3<double> **)(in_RDI + 0x138) = in_stack_ffffffffffffff70;
    *(undefined8 *)(in_RDI + 0x140) = local_88;
    *(undefined8 *)(in_RDI + 0x148) = local_80;
  }
  if ((local_29 & 1) == 0) {
    faceForward<double>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    *(Normal3<double> **)(in_RDI + 0x138) = in_stack_ffffffffffffff40;
    *(Normal3<double> **)(in_RDI + 0x140) = in_stack_ffffffffffffff48;
    *(Normal3<double> **)(in_RDI + 0x148) = in_stack_ffffffffffffff50;
  }
  else {
    faceForward<double>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    *(undefined8 *)(in_RDI + 0x18) = local_a8;
    *(undefined8 *)(in_RDI + 0x20) = local_a0;
    *(Vector3<double> **)(in_RDI + 0x28) = in_stack_ffffffffffffff68;
  }
  *(undefined8 *)(in_RDI + 0x150) = *local_10;
  *(undefined8 *)(in_RDI + 0x158) = local_10[1];
  *(undefined8 *)(in_RDI + 0x160) = local_10[2];
  *(undefined8 *)(in_RDI + 0x168) = *local_18;
  *(undefined8 *)(in_RDI + 0x170) = local_18[1];
  *(undefined8 *)(in_RDI + 0x178) = local_18[2];
  *(undefined8 *)(in_RDI + 0x180) = *local_20;
  *(undefined8 *)(in_RDI + 0x188) = local_20[1];
  *(undefined8 *)(in_RDI + 400) = local_20[2];
  *(undefined8 *)(in_RDI + 0x198) = *local_28;
  *(undefined8 *)(in_RDI + 0x1a0) = local_28[1];
  *(undefined8 *)(in_RDI + 0x1a8) = local_28[2];
  *(byte *)(in_RDI + 0x1b0) = local_29 & 1;
  return;
}

Assistant:

void SurfaceInteraction::setShadingGeomerty(const Vector3f& dpdus, const Vector3f& dpdvs,
                        const Normal3f& dndus, const Normal3f& dndvs,
                        bool overridesOrientation) {
    shadingGeom.n = normalize(Normal3f(cross(dpdus, dpdvs)));

    // Check if normal needs to be flipped
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys))
        shadingGeom.n = -shadingGeom.n;
    if (overridesOrientation) {
        // Shading normal has higher priority.
        // Flip true geometry normal to align with shading normal
        n = faceForward(n, shadingGeom.n);
    } else {
        // True geometry normal has higher priority.
        // Flip shading normal to align with true geometry normal
        shadingGeom.n = faceForward(shadingGeom.n, n);
    }

    shadingGeom.dpdu = dpdus; shadingGeom.dpdv = dpdvs;
    shadingGeom.dndu = dndus; shadingGeom.dndv = dndvs;
    shadingGeom.overridesOrientation = overridesOrientation;
}